

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O2

size_t gog::anon_unknown_0::probe_bin_file_series
                 (extract_options *o,info *info,path *dir,string *basename,size_t format,
                 size_t start)

{
  path *p;
  streamsize *os;
  pointer ppVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  size_t i;
  long *plVar5;
  long lVar6;
  __sighandler_t __handler;
  __sighandler_t __handler_00;
  __sighandler_t __handler_01;
  ostream *poVar7;
  runtime_error *prVar8;
  info *info_00;
  string *file_00;
  byte bVar9;
  string *this;
  undefined1 auVar10 [16];
  path *local_538;
  vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> files;
  long local_508;
  path first_file;
  char magic [4];
  string basename_1;
  char hash [16];
  undefined1 local_498 [16];
  path local_488;
  path here;
  size_t local_448;
  string password;
  path symlink;
  string local_3f0 [8];
  long local_3e8;
  path file;
  string local_258 [32];
  ifstream ifs;
  
  files.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  files.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  files.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_448 = 0;
  do {
    file.m_pathname._M_string_length = 0;
    file.m_pathname._M_dataplus._M_p = (pointer)&file.m_pathname.field_2;
    file.m_pathname.field_2._M_local_buf[0] = '\0';
    if (format == 0) {
      std::__cxx11::string::string((string *)hash,(string *)basename);
      boost::filesystem::operator/((path *)&ifs,dir,(path *)hash);
      std::__cxx11::string::operator=((string *)&file,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      this = (string *)hash;
    }
    else {
      stream::slice_reader::slice_filename(&first_file.m_pathname,basename,start,format);
      std::__cxx11::string::string((string *)hash,(string *)&first_file.m_pathname);
      boost::filesystem::operator/((path *)&ifs,dir,(path *)hash);
      std::__cxx11::string::operator=((string *)&file,(string *)&ifs);
      std::__cxx11::string::~string((string *)&ifs);
      std::__cxx11::string::~string((string *)hash);
      this = (string *)&first_file;
    }
    std::__cxx11::string::~string(this);
    bVar3 = boost::filesystem::is_regular_file(&file);
    if (bVar3) {
      bVar3 = format != 0;
      if (o->gog == true) {
        std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::push_back
                  (&files,(value_type *)&file);
      }
      else {
        ifs.super_basic_ifstream<char,_std::char_traits<char>_>.
        super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream._0_4_ = 2;
        std::__cxx11::ostringstream::ostringstream
                  ((ostringstream *)
                   &ifs.super_basic_ifstream<char,_std::char_traits<char>_>.
                    super_basic_istream<char,_std::char_traits<char>_>._M_gcount);
        boost::filesystem::path::filename();
        os = &ifs.super_basic_ifstream<char,_std::char_traits<char>_>.
              super_basic_istream<char,_std::char_traits<char>_>._M_gcount;
        boost::filesystem::operator<<
                  ((basic_ostream<char,_std::char_traits<char>_> *)os,(path *)hash);
        std::operator<<((ostream *)os," is not part of the installer!");
        std::__cxx11::string::~string((string *)hash);
        logger::~logger((logger *)&ifs);
        local_448 = local_448 + 1;
      }
    }
    else {
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&file);
    start = start + 1;
  } while (bVar3);
  if (files.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      files.super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::basic_ifstream
              (&ifs,files.
                    super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                    ._M_impl.super__Vector_impl_data._M_start,_S_in|_S_bin);
    cVar4 = std::__basic_file<char>::is_open();
    if (cVar4 == '\0') {
      prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hash,
                     "Could not open file \"",
                     &(files.
                       super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_pathname);
      std::operator+(&file.m_pathname,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hash,'\"')
      ;
      std::runtime_error::runtime_error(prVar8,(string *)&file);
      __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar5 = (long *)std::istream::read((char *)&ifs,(long)magic);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
LAB_0012031e:
      auVar10 = __cxa_allocate_exception(0x10);
      (anonymous_namespace)::get_verb_abi_cxx11_
                (&basename_1,(_anonymous_namespace_ *)o,auVar10._8_8_);
      std::operator+(&here.m_pathname,"Could not ",&basename_1);
      std::operator+(&first_file.m_pathname,&here.m_pathname," \"");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hash,
                     &first_file.m_pathname,
                     &(files.
                       super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_pathname);
      std::operator+(&file.m_pathname,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hash,
                     "\": unknown filetype");
      std::runtime_error::runtime_error(auVar10._0_8_,(string *)&file);
      __cxa_throw(auVar10._0_8_,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (magic == (char  [4])0x21726152) {
      std::ifstream::close();
      if ((((o->list != false) || (o->test != false)) || (o->extract == true)) &&
         (files.
          super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          files.
          super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>.
          _M_impl.super__Vector_impl_data._M_finish)) {
        get_game_id_abi_cxx11_(&password,(gog *)info,info_00);
        if (password._M_string_length != 0) {
          crypto::iterated_hash<crypto::md5_transform>::init
                    ((iterated_hash<crypto::md5_transform> *)&file,(EVP_PKEY_CTX *)info);
          crypto::iterated_hash<crypto::md5_transform>::update
                    ((iterated_hash<crypto::md5_transform> *)&file,password._M_dataplus._M_p,
                     password._M_string_length);
          crypto::iterated_hash<crypto::md5_transform>::finalize
                    ((iterated_hash<crypto::md5_transform> *)&file,hash);
          std::__cxx11::string::resize((ulong)&password);
          for (lVar6 = 0; lVar6 != 0x10; lVar6 = lVar6 + 1) {
            cVar4 = '0';
            if (0x9f < (byte)hash[lVar6]) {
              cVar4 = 'W';
            }
            password._M_dataplus._M_p[lVar6 * 2] = cVar4 + ((byte)hash[lVar6] >> 4);
            cVar4 = '0';
            if (9 < (hash[lVar6] & 0xfU)) {
              cVar4 = 'W';
            }
            password._M_dataplus._M_p[lVar6 * 2 + 1] = cVar4 + (hash[lVar6] & 0xfU);
          }
        }
        ppVar1 = files.
                 super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((((o->extract == false) && (o->test == false)) && (o->list == true)) ||
           ((long)files.
                  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)files.
                  super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20)) {
          bVar9 = 1;
          for (file_00 = &(files.
                           super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_pathname;
              file_00 != &ppVar1->m_pathname; file_00 = file_00 + 1) {
            bVar3 = process_rar_file(file_00,o,&password);
            bVar9 = bVar9 & bVar3;
          }
          if (bVar9 == 0) {
LAB_00120483:
            auVar10 = __cxa_allocate_exception(0x10);
            (anonymous_namespace)::get_verb_abi_cxx11_
                      (&basename_1,(_anonymous_namespace_ *)o,auVar10._8_8_);
            std::operator+(&here.m_pathname,"Could not ",&basename_1);
            std::operator+(&first_file.m_pathname,&here.m_pathname," \"");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hash
                           ,&first_file.m_pathname,
                           &(files.
                             super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                             ._M_impl.super__Vector_impl_data._M_start)->m_pathname);
            std::operator+(&file.m_pathname,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)hash
                           ,"\": install `unrar` or `unar`");
            std::runtime_error::runtime_error(auVar10._0_8_,(string *)&file);
            __cxa_throw(auVar10._0_8_,&std::runtime_error::typeinfo,
                        std::runtime_error::~runtime_error);
          }
        }
        else {
          __handler = signal(2,quit_handler);
          __handler_00 = signal(0xf,quit_handler);
          __handler_01 = signal(1,quit_handler);
          hash._0_8_ = local_498;
          hash[8] = '\0';
          hash[9] = '\0';
          hash[10] = '\0';
          hash[0xb] = '\0';
          hash[0xc] = '\0';
          hash[0xd] = '\0';
          hash[0xe] = '\0';
          hash[0xf] = '\0';
          p = &o->output_dir;
          local_498[0] = '\0';
          local_488.m_pathname._M_dataplus._M_p = (pointer)&local_488.m_pathname.field_2;
          local_488.m_pathname._M_string_length = 0;
          local_488.m_pathname.field_2._M_local_buf[0] = None;
          if (((o->output_dir).m_pathname._M_string_length != 0) &&
             (bVar3 = boost::filesystem::exists(p), !bVar3)) {
            boost::filesystem::create_directory(p);
            std::__cxx11::string::_M_assign((string *)hash);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&file);
          do {
            first_file.m_pathname._M_dataplus._M_p = (pointer)&first_file.m_pathname.field_2;
            first_file.m_pathname._M_string_length = 0;
            first_file.m_pathname.field_2._M_local_buf[0] = '\0';
            std::__cxx11::stringbuf::str((string *)&file.m_pathname._M_string_length);
            std::__cxx11::string::~string((string *)&first_file);
            poVar7 = std::operator<<((ostream *)&file,"innoextract-tmp-");
            std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::string((string *)&here,(string *)&basename_1);
            boost::filesystem::operator/(&first_file,p,&here);
            std::__cxx11::string::operator=((string *)&local_488,(string *)&first_file);
            std::__cxx11::string::~string((string *)&first_file);
            std::__cxx11::string::~string((string *)&here);
            std::__cxx11::string::~string((string *)&basename_1);
            bVar3 = boost::filesystem::exists(&local_488);
          } while (bVar3);
          boost::filesystem::create_directory(&local_488);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&file);
          first_file.m_pathname._M_dataplus._M_p = (pointer)&first_file.m_pathname.field_2;
          first_file.m_pathname._M_string_length = 0;
          first_file.m_pathname.field_2._M_local_buf[0] = '\0';
          boost::filesystem::current_path();
          boost::filesystem::path::stem();
          std::__cxx11::string::string((string *)&basename_1,(string *)&file);
          std::__cxx11::string::~string((string *)&file);
          bVar3 = boost::algorithm::
                  ends_with<std::__cxx11::string,char[3],boost::algorithm::is_equal>
                            (&basename_1,"-1");
          if (bVar3) {
            std::__cxx11::string::resize((ulong)&basename_1);
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&file);
          ppVar1 = files.
                   super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          bVar3 = true;
          local_508 = 0;
          for (local_538 = files.
                           super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                           ._M_impl.super__Vector_impl_data._M_start;
              (bVar3 && (local_538 != ppVar1)); local_538 = local_538 + bVar3) {
            bVar3 = false;
            for (lVar6 = 0; (int)lVar6 != 1; lVar6 = lVar6 + 1) {
              symlink.m_pathname._M_dataplus._M_p = (pointer)&symlink.m_pathname.field_2;
              symlink.m_pathname._M_string_length = 0;
              symlink.m_pathname.field_2._M_local_buf[0] = '\0';
              std::__cxx11::stringbuf::str((string *)&file.m_pathname._M_string_length);
              std::__cxx11::string::~string((string *)&symlink);
              poVar7 = std::operator<<((ostream *)&file,(string *)&basename_1);
              poVar7 = std::operator<<(poVar7,".r");
              poVar7 = std::operator<<(poVar7,0x30);
              *(undefined8 *)(&poVar7->field_0x10 + (long)poVar7->_vptr_basic_ostream[-3]) = 2;
              std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::__cxx11::stringbuf::str();
              std::__cxx11::string::string(local_3f0,local_258);
              boost::filesystem::operator/(&symlink,&local_488,(path *)local_3f0);
              std::__cxx11::string::~string(local_3f0);
              std::__cxx11::string::~string(local_258);
              boost::filesystem::path::root_path();
              lVar2 = local_3e8;
              std::__cxx11::string::~string(local_3f0);
              if (lVar2 == 0) {
                boost::filesystem::operator/((path *)local_3f0,&here,local_538);
                boost::filesystem::create_symlink((path *)local_3f0,&symlink);
                std::__cxx11::string::~string(local_3f0);
              }
              else {
                boost::filesystem::create_symlink(local_538,&symlink);
              }
              if (local_508 + lVar6 == 0) {
                std::__cxx11::string::_M_assign((string *)&first_file);
              }
              std::__cxx11::string::~string((string *)&symlink);
              bVar3 = true;
            }
            local_508 = local_508 + lVar6;
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&file);
          std::__cxx11::string::~string((string *)&basename_1);
          std::__cxx11::string::~string((string *)&here);
          bVar3 = process_rar_file(&first_file.m_pathname,o,&password);
          if (!bVar3) {
            signal(1,__handler_01);
            signal(0xf,__handler_00);
            signal(2,__handler);
            if ((anonymous_namespace)::quit_requested != 0) {
              prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
              std::runtime_error::runtime_error(prVar8,"Aborted!");
              __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            std::__cxx11::string::~string((string *)&first_file);
            temporary_directory::~temporary_directory((temporary_directory *)hash);
            goto LAB_00120483;
          }
          std::__cxx11::string::~string((string *)&first_file);
          temporary_directory::~temporary_directory((temporary_directory *)hash);
        }
        std::__cxx11::string::~string((string *)&password);
      }
    }
    else {
      if ((magic._0_2_ != 0x5a4d) ||
         (loader::offsets::load((offsets *)hash,(istream *)&ifs),
         local_488.m_pathname.field_2._8_4_ == 0)) goto LAB_0012031e;
      std::ifstream::close();
      extract_options::extract_options((extract_options *)&file,o);
      file.m_pathname._M_string_length = file.m_pathname._M_string_length & 0xffffffffffffff;
      file.m_pathname._M_dataplus._M_p._2_1_ = 0;
      std::operator<<((ostream *)&std::cout,'\n');
      process_file(files.
                   super__Vector_base<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>
                   ._M_impl.super__Vector_impl_data._M_start,(extract_options *)&file);
      extract_options::~extract_options((extract_options *)&file);
    }
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::~basic_ifstream(&ifs);
  }
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::~vector(&files);
  return local_448;
}

Assistant:

size_t probe_bin_file_series(const extract_options & o, const setup::info & info, const fs::path & dir,
                             const std::string & basename, size_t format = 0, size_t start = 0) {
	
	size_t count = 0;
	
	std::vector<fs::path> files;
	
	for(size_t i = start;; i++) {
		
		fs::path file;
		if(format == 0) {
			file = dir / basename;
		} else {
			file = dir / stream::slice_reader::slice_filename(basename, i, format);
		}
		
		try {
			if(!fs::is_regular_file(file)) {
				break;
			}
		} catch(...) {
			break;
		}
		
		if(o.gog) {
			files.push_back(file);
		} else {
			log_warning << file.filename() << " is not part of the installer!";
			count++;
		}
		
		if(format == 0) {
			break;
		}
		
	}
	
	if(!files.empty()) {
		process_bin_files(files, o, info);
	}
	
	return count;
}